

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
       *this,BinaryReader<mp::internal::IdentityConverter> *bound_reader)

{
  StringRef name_00;
  CStringRef arg0;
  CStringRef arg0_00;
  CStringRef arg0_01;
  CStringRef arg0_02;
  CStringRef arg0_03;
  bool bVar1;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *this_00;
  long in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffec8;
  BinaryReader<mp::internal::IdentityConverter> *in_stack_fffffffffffffed0;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_fffffffffffffed8;
  ExprBase in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_fffffffffffffef0;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  BasicCStringRef<char> in_stack_ffffffffffffff40;
  BasicCStringRef<char> local_b8;
  BasicCStringRef<char> local_b0;
  BasicCStringRef<char> local_a8;
  uint local_9c;
  char *local_98;
  size_t local_90;
  StringRef local_88;
  int local_74;
  BasicCStringRef<char> local_70;
  int local_68;
  int local_64;
  ExprBase local_60;
  int local_54;
  int local_50;
  int local_4c;
  Impl *local_48;
  ExprBase local_40;
  int local_38;
  int local_34;
  ExprBase local_30;
  int local_24;
  ExprBase local_20;
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  in_RDI->num_vars_and_exprs_ =
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons
       + (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.
         num_common_exprs_in_single_objs;
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
    this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
               *)(ulong)(uint)(int)local_12;
    switch(this_00) {
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x0:
      bVar1 = ReaderBase::IsEOF((ReaderBase *)0x1b479b);
      if (bVar1) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_b8,"segment \'b\' missing");
          arg0_02.data_._4_4_ = in_stack_ffffffffffffff04;
          arg0_02.data_._0_4_ = in_stack_ffffffffffffff00;
          BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffef8,arg0_02);
        }
        return;
      }
    default:
      in_stack_fffffffffffffec8 = in_RDI->reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffff40,"invalid segment type");
      arg0_03.data_._4_4_ = in_stack_ffffffffffffff04;
      arg0_03.data_._0_4_ = in_stack_ffffffffffffff00;
      BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffef8,arg0_03);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x43:
      local_18 = ReadUInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      in_stack_ffffffffffffff20 =
           (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
            *)in_RDI->handler_;
      in_stack_ffffffffffffff2c = local_18;
      local_20.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffed8,
                                   SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::OnAlgebraicCon((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                        *)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                       (NumericExpr)in_stack_fffffffffffffee0.impl_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x46:
      local_64 = ReadUInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      local_68 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffee0.impl_);
      if ((local_68 != 0) && (local_68 != 1)) {
        in_stack_fffffffffffffef0 =
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              *)in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"invalid function type");
        arg0.data_._4_4_ = in_stack_ffffffffffffff04;
        arg0.data_._0_4_ = in_stack_ffffffffffffff00;
        BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffef8,arg0);
      }
      local_74 = BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                           (in_stack_fffffffffffffed0);
      local_88 = BinaryReader<mp::internal::IdentityConverter>::ReadName
                           ((BinaryReader<mp::internal::IdentityConverter> *)0x1b453c);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_98 = local_88.data_;
      local_90 = local_88.size_;
      name_00.data_._4_4_ = in_stack_fffffffffffffeec;
      name_00.data_._0_4_ = in_stack_fffffffffffffee8;
      name_00.size_ = (size_t)in_stack_fffffffffffffef0;
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::OnFunction((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                    *)in_stack_fffffffffffffee0.impl_,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),name_00,
                   (int)in_stack_fffffffffffffed8,(Type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ObjHandler>
                (in_stack_fffffffffffffef0);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::AlgebraicConHandler>
                (in_stack_fffffffffffffef0);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x4b:
      ReadColumnSizes<false>(in_stack_fffffffffffffef0);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x4c:
      local_24 = ReadUInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_30.impl_ = (Impl *)ReadLogicalExpr(in_stack_fffffffffffffef8);
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::OnLogicalCon((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                      *)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                     (LogicalExpr)in_stack_fffffffffffffee0.impl_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x4f:
      local_34 = ReadUInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      local_38 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffee0.impl_);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      local_40.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffed8,
                                   SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
      bVar1 = NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
              ::NeedObj((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                         *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                       );
      if (bVar1) {
        NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
        ::resulting_obj_index
                  ((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                    *)in_RDI->handler_,local_34);
        local_48 = local_40.impl_;
        NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
        ::OnObj((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                 *)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                (Type)in_stack_fffffffffffffed0,(NumericExpr)in_stack_fffffffffffffee0.impl_);
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x53:
      local_9c = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffee0.impl_);
      if (7 < (int)local_9c) {
        in_stack_fffffffffffffee8 = (uint)in_RDI->reader_;
        in_stack_fffffffffffffeec = (uint)((ulong)in_RDI->reader_ >> 0x20);
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_a8,"invalid suffix kind");
        arg0_00.data_._4_4_ = in_stack_ffffffffffffff04;
        arg0_00.data_._0_4_ = in_stack_ffffffffffffff00;
        BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffef8,arg0_00);
      }
      in_stack_fffffffffffffee0.impl_ = (Impl *)(ulong)(local_9c & 3);
      switch(in_stack_fffffffffffffee0.impl_) {
      case (Impl *)0x0:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::VarHandler>
                  (this_00,in_stack_ffffffffffffff2c);
        break;
      case (Impl *)0x1:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ConHandler>
                  (this_00,in_stack_ffffffffffffff2c);
        break;
      case (Impl *)0x2:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ObjHandler>
                  (this_00,in_stack_ffffffffffffff2c);
        break;
      case (Impl *)0x3:
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ProblemHandler>
                  (this_00,in_stack_ffffffffffffff2c);
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x56:
      local_4c = ReadUInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                          in_stack_fffffffffffffee8);
      local_4c = local_4c - (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      local_50 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffee0.impl_);
      local_54 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                           ((BinaryReader<mp::internal::IdentityConverter> *)
                            in_stack_fffffffffffffee0.impl_);
      BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::BeginCommonExpr((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                         *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                        ,(int)in_stack_fffffffffffffec8);
      if (local_50 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::LinearExprHandler>
                  (in_RDI,local_50);
      }
      in_stack_fffffffffffffef8 =
           (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
            *)in_RDI->handler_;
      in_stack_ffffffffffffff04 = local_4c;
      local_60.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffed8,
                                   SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
      NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
      ::EndCommonExpr((NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
                       *)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                      (NumericExpr)in_stack_fffffffffffffee0.impl_,(int)in_stack_fffffffffffffed0);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x62:
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_fffffffffffffed8 =
               (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                *)in_RDI->reader_;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_b0,"duplicate \'b\' segment");
          arg0_01.data_._4_4_ = in_stack_ffffffffffffff04;
          arg0_01.data_._0_4_ = in_stack_ffffffffffffff00;
          BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffef8,arg0_01);
        }
        BinaryReader<mp::internal::IdentityConverter>::operator=
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::VarHandler>
                  (in_stack_ffffffffffffff20);
        ReaderBase::ptr((ReaderBase *)in_RDI->reader_);
        if ((in_RDI->flags_ & 1U) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x64:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x6b:
      ReadColumnSizes<true>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x72:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *)in_stack_ffffffffffffff40.data_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          *)0x78:
      NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}